

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::Asset::Asset(Asset *this)

{
  _Rb_tree_header *p_Var1;
  allocator local_11;
  
  std::__cxx11::string::string((string *)this,"2.0",&local_11);
  (this->generator)._M_dataplus._M_p = (pointer)&(this->generator).field_2;
  (this->generator)._M_string_length = 0;
  (this->generator).field_2._M_local_buf[0] = '\0';
  (this->minVersion)._M_dataplus._M_p = (pointer)&(this->minVersion).field_2;
  (this->minVersion)._M_string_length = 0;
  (this->minVersion).field_2._M_local_buf[0] = '\0';
  (this->copyright)._M_dataplus._M_p = (pointer)&(this->copyright).field_2;
  (this->copyright)._M_string_length = 0;
  (this->copyright).field_2._M_local_buf[0] = '\0';
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Value::Value(&this->extras);
  (this->extras_json_string)._M_dataplus._M_p = (pointer)&(this->extras_json_string).field_2;
  (this->extras_json_string)._M_string_length = 0;
  (this->extras_json_string).field_2._M_local_buf[0] = '\0';
  (this->extensions_json_string)._M_dataplus._M_p = (pointer)&(this->extensions_json_string).field_2
  ;
  (this->extensions_json_string)._M_string_length = 0;
  (this->extensions_json_string).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

Asset() = default;